

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device_read__alsa
                    (ma_device *pDevice,void *pFramesOut,ma_uint32 frameCount,ma_uint32 *pFramesRead
                    )

{
  int iVar1;
  ma_result mVar2;
  long lVar3;
  ma_log_proc p_Var4;
  char *pcVar5;
  ma_context *pmVar6;
  
  if (pFramesOut == (void *)0x0) {
    __assert_fail("pFramesOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x453f,
                  "ma_result ma_device_read__alsa(ma_device *, void *, ma_uint32, ma_uint32 *)");
  }
  if (pFramesRead != (ma_uint32 *)0x0) {
    *pFramesRead = 0;
  }
  do {
    do {
      lVar3 = (*(pDevice->pContext->field_21).alsa.snd_pcm_readi)
                        ((pDevice->field_23).alsa.pPCMCapture,pFramesOut,(ulong)frameCount);
      if (-1 < lVar3) {
        if (pFramesRead == (ma_uint32 *)0x0) {
          return 0;
        }
        *pFramesRead = (ma_uint32)lVar3;
        return 0;
      }
    } while (lVar3 != -0x20);
    iVar1 = (*(pDevice->pContext->field_21).alsa.snd_pcm_recover)
                      ((pDevice->field_23).alsa.pPCMCapture,0xffffffe0,1);
    if (iVar1 < 0) {
      mVar2 = ma_result_from_errno(-iVar1);
      pmVar6 = pDevice->pContext;
      if (pmVar6 == (ma_context *)0x0) {
        return mVar2;
      }
      p_Var4 = pmVar6->logCallback;
      if (p_Var4 == (ma_log_proc)0x0) {
        return mVar2;
      }
      pcVar5 = "[ALSA] Failed to recover device after overrun.";
      goto LAB_00108a0c;
    }
    iVar1 = (*(pDevice->pContext->field_21).alsa.snd_pcm_start)
                      ((pDevice->field_23).alsa.pPCMCapture);
    if (iVar1 < 0) {
      mVar2 = ma_result_from_errno(-iVar1);
      pmVar6 = pDevice->pContext;
      if (pmVar6 == (ma_context *)0x0) {
        return mVar2;
      }
      p_Var4 = pmVar6->logCallback;
      if (p_Var4 == (ma_log_proc)0x0) {
        return mVar2;
      }
      pcVar5 = "[ALSA] Failed to start device after underrun.";
      goto LAB_00108a0c;
    }
    lVar3 = (*(pDevice->pContext->field_21).alsa.snd_pcm_readi)
                      ((pDevice->field_23).alsa.pPCMCapture,pFramesOut,(ulong)frameCount);
  } while (-1 < lVar3);
  mVar2 = ma_result_from_errno(-(int)lVar3);
  pmVar6 = pDevice->pContext;
  if ((pmVar6 != (ma_context *)0x0) && (p_Var4 = pmVar6->logCallback, p_Var4 != (ma_log_proc)0x0)) {
    pcVar5 = "[ALSA] Failed to read data from the internal device.";
LAB_00108a0c:
    (*p_Var4)(pmVar6,pDevice,1,pcVar5);
  }
  return mVar2;
}

Assistant:

static ma_result ma_device_read__alsa(ma_device* pDevice, void* pFramesOut, ma_uint32 frameCount, ma_uint32* pFramesRead)
{
    ma_snd_pcm_sframes_t resultALSA;

    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(pFramesOut != NULL);

    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    for (;;) {
        resultALSA = ((ma_snd_pcm_readi_proc)pDevice->pContext->alsa.snd_pcm_readi)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture, pFramesOut, frameCount);
        if (resultALSA >= 0) {
            break;  /* Success. */
        } else {
            if (resultALSA == -EAGAIN) {
                /*printf("TRACE: EGAIN (read)\n");*/
                continue;   /* Try again. */
            } else if (resultALSA == -EPIPE) {
            #if defined(MA_DEBUG_OUTPUT)
                printf("TRACE: EPIPE (read)\n");
            #endif

                /* Overrun. Recover and try again. If this fails we need to return an error. */
                resultALSA = ((ma_snd_pcm_recover_proc)pDevice->pContext->alsa.snd_pcm_recover)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture, resultALSA, MA_TRUE);
                if (resultALSA < 0) {
                    return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to recover device after overrun.", ma_result_from_errno((int)-resultALSA));
                }

                resultALSA = ((ma_snd_pcm_start_proc)pDevice->pContext->alsa.snd_pcm_start)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture);
                if (resultALSA < 0) {
                    return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to start device after underrun.", ma_result_from_errno((int)-resultALSA));
                }

                resultALSA = ((ma_snd_pcm_readi_proc)pDevice->pContext->alsa.snd_pcm_readi)((ma_snd_pcm_t*)pDevice->alsa.pPCMCapture, pFramesOut, frameCount);
                if (resultALSA < 0) {
                    return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[ALSA] Failed to read data from the internal device.", ma_result_from_errno((int)-resultALSA));
                }
            }
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = resultALSA;
    }

    return MA_SUCCESS;
}